

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

Am_Object get_command_to_undo(Am_Object *cmd)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *pAVar3;
  Am_Slot_Key in_SI;
  undefined1 local_58 [8];
  Am_Value_List l;
  Am_Object local_38;
  Am_Object local_30;
  undefined1 local_28 [8];
  Am_Value value;
  Am_Object *cmd_local;
  Am_Object *undo_cmd;
  
  Am_Object::Get_Object(&local_38,in_SI,0x170);
  Am_Object::Get_Sibling(&local_30,(Am_Slot_Key)&local_38,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar3 = Am_Object::Peek(&local_30,0x169,0);
  Am_Value::Am_Value((Am_Value *)local_28,pAVar3);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_38);
  bVar1 = Am_Value::Valid((Am_Value *)local_28);
  if (bVar1) {
    Am_Value_List::Am_Value_List((Am_Value_List *)local_58,(Am_Value *)local_28);
    uVar2 = Am_Value_List::Length((Am_Value_List *)local_58);
    if (uVar2 == 1) {
      Am_Value_List::Start((Am_Value_List *)local_58);
      pAVar3 = Am_Value_List::Get((Am_Value_List *)local_58);
      Am_Object::Am_Object(cmd,pAVar3);
    }
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_58);
    if (uVar2 == 1) goto LAB_002d337d;
  }
  Am_Object::Am_Object(cmd,&Am_No_Object);
LAB_002d337d:
  Am_Value::~Am_Value((Am_Value *)local_28);
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
get_command_to_undo(Am_Object cmd)
{
  Am_Value value = cmd.Get_Object(Am_SAVED_OLD_OWNER)
                       .Get_Sibling(Am_UNDO_SCROLL_GROUP)
                       .Peek(Am_VALUE);
  if (value.Valid()) {
    Am_Value_List l = value;
    if (l.Length() == 1) {
      l.Start();
      // because id is the cmd to undo, it will be the value of the menu
      Am_Object undo_cmd = l.Get();
      return (undo_cmd);
    }
  }
  return Am_No_Object;
}